

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCinit(void)

{
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR *local_20;
  LispPTR *local_10;
  
  atom_instance = get_package_atom("instance",8,"INTERLISP",9,0);
  atom_class = get_package_atom("class",5,"INTERLISP",9,0);
  atom_annotatedValue = get_package_atom("annotatedValue",0xe,"INTERLISP",9,0);
  atom_FetchMethodOrHelp_LCUFN = get_package_atom("\\FetchMethodOrHelp-LCUFN",0x18,"INTERLISP",9,0);
  atom_FetchMethod_LCUFN = get_package_atom("\\FetchMethod-LCUFN",0x12,"INTERLISP",9,0);
  atom_FindVarIndex_LCUFN = get_package_atom("\\FindVarIndex-LCUFN",0x13,"INTERLISP",9,0);
  atom_GetIVValue_LCUFN = get_package_atom("\\GetIVValue-LCUFN",0x11,"INTERLISP",9,0);
  atom_PutIVValue_LCUFN = get_package_atom("\\PutIVValue-LCUFN",0x11,"INTERLISP",9,0);
  LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
  pDVar1 = AtomSpace;
  if ((LVar2 & 0xfff0000) == 0) {
    LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
    local_10 = (LispPTR *)(pDVar1 + (ulong)(LVar2 * 5) * 2);
  }
  else {
    LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
    local_10 = NativeAligned4FromLAddr(LVar2);
  }
  local_10 = local_10 + 1;
  LCMethodCache = (LCMethodCacheEntry *)NativeAligned4FromLAddr(*local_10);
  LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
  pDVar1 = AtomSpace;
  if ((LVar2 & 0xfff0000) == 0) {
    LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
    local_20 = (LispPTR *)(pDVar1 + (ulong)(LVar2 * 5) * 2);
  }
  else {
    LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
    local_20 = NativeAligned4FromLAddr(LVar2);
  }
  local_20 = local_20 + 1;
  LCIVCache = (LCIVCacheEntry *)NativeAligned4FromLAddr(*local_20);
  return 0;
}

Assistant:

LispPTR LCinit(void) {
  atom_instance = GET_IL_ATOM("instance");
  atom_class = GET_IL_ATOM("class");
  atom_annotatedValue = GET_IL_ATOM("annotatedValue");
  atom_FetchMethodOrHelp_LCUFN = GET_IL_ATOM("\\FetchMethodOrHelp-LCUFN");
  atom_FetchMethod_LCUFN = GET_IL_ATOM("\\FetchMethod-LCUFN");
  atom_FindVarIndex_LCUFN = GET_IL_ATOM("\\FindVarIndex-LCUFN");
  atom_GetIVValue_LCUFN = GET_IL_ATOM("\\GetIVValue-LCUFN");
  atom_PutIVValue_LCUFN = GET_IL_ATOM("\\PutIVValue-LCUFN");
  LCMethodCache = (struct LCMethodCacheEntry *)AtomValPtr(GET_IL_ATOM("*Global-Method-Cache*"));
  LCIVCache = (struct LCIVCacheEntry *)AtomValPtr(GET_IL_ATOM("*Global-IV-Cache-Block*"));
  return NIL_PTR; /* in case called from lisp */
}